

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

optional<metaf::Speed> metaf::Speed::fromString(string *s,Unit unit)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  optional<metaf::Speed> oVar8;
  
  uVar7 = 0x100000000;
  if (s->_M_string_length == 0) {
LAB_001a78d6:
    uVar5 = 0x100000000;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)s);
    if (iVar3 == 0) goto LAB_001a78d6;
    uVar5 = s->_M_string_length;
    uVar4 = 0;
    if ((uVar5 == 2) || ((uVar5 == 3 && (*(s->_M_dataplus)._M_p != '0')))) {
      uVar6 = 0;
      do {
        cVar1 = (s->_M_dataplus)._M_p[uVar6];
        if ((byte)(cVar1 - 0x3aU) < 0xf6) {
          uVar4 = 0;
          bVar2 = false;
          goto LAB_001a78e1;
        }
        uVar4 = (ulong)((uint)(byte)(cVar1 - 0x30) + (int)uVar4 * 10);
        uVar6 = uVar6 + 1;
      } while ((uVar6 & 0xffffffff) < uVar5);
      bVar2 = true;
LAB_001a78e1:
      if (bVar2) {
        uVar5 = (ulong)unit | 0x100000000;
        goto LAB_001a78f2;
      }
    }
    uVar5 = 0;
  }
  uVar4 = 0;
  uVar7 = 0;
LAB_001a78f2:
  oVar8.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Speed>._M_payload._0_8_ = uVar4 | uVar7;
  oVar8.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Speed>._8_8_ = uVar5;
  return (optional<metaf::Speed>)
         oVar8.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Speed>;
}

Assistant:

std::optional<Speed> Speed::fromString(const std::string & s, Unit unit) {
	//static const std::regex rgx ("([1-9]?\\d\\d)|//");
	static const std::optional<Speed> error;
	if (s.empty() || s == "//") return Speed();
	if (s.length() != 2 && s.length() != 3) return error;
	if (s.length() == 3 && s[0] == '0') return error;
	const auto spd = strToUint(s, 0, s.length());
	if (!spd.has_value()) return error;
	Speed speed;
	speed.speedUnit = unit;
	speed.speedValue = *spd;
	return speed;
}